

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall cab_provision_simple::test_method(cab_provision_simple *this)

{
  cab_manager *this_00;
  shared_ptr<cab> c;
  shared_ptr<cab_session> session;
  __weak_ptr<cab_session,(__gnu_cxx::_Lock_policy)2> local_148 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_140;
  assertion_result local_138;
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_int>,_int,_boost::test_tools::assertion::op::EQ<unsigned_int,_int,_void>_>
  local_120;
  const_string local_118;
  char *local_108;
  char *local_100;
  const_string local_f8;
  const_string local_e8;
  lazy_ostream local_d8;
  undefined1 *local_c8;
  char **local_c0;
  cab_manager manager;
  
  cab_manager::cab_manager(&manager);
  session.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  session.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__weak_ptr<cab_session,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<cab_session,void>
            (local_148,&session.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>);
  cab_manager::create(&manager,(weak_ptr<cab_session> *)local_148);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&local_140);
  this_00 = (cab_manager *)&c;
  cab_manager::find_cab(this_00,(node_type)&manager,P0,0xb);
  local_e8.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  local_e8.m_end = "";
  local_f8.m_begin = "";
  local_f8.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)this_00,&local_e8,299,&local_f8);
  local_120.m_lhs.m_value = cab::id(c.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  local_120.m_rhs = 0;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_int>,_int,_boost::test_tools::assertion::op::EQ<unsigned_int,_int,_void>_>
  ::evaluate(&local_138,&local_120,false);
  local_c0 = &local_108;
  local_108 = "c->id() == 0";
  local_100 = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001a9520;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_118.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
  ;
  local_118.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_138,&local_d8,&local_118,299,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&session.super___shared_ptr<cab_session,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  cab_manager::~cab_manager(&manager);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(cab_provision_simple)
{
    cab_manager manager;
    std::shared_ptr<cab_session> session = nullptr;

    manager.create(session);

    node_type src = node_type::P0;
    node_type dst = node_type::P5;

    std::shared_ptr<cab> c = manager.find_cab(src, dst, 1);
    BOOST_TEST(c->id() == 0);
}